

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O2

void __thiscall
pbrt::SpotLight::SpotLight
          (SpotLight *this,Transform *renderFromLight,MediumInterface *mediumInterface,
          SpectrumHandle *I,Float scale,Float totalWidth,Float falloffStart,Allocator alloc)

{
  float fVar1;
  Float vb;
  Float va;
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  local_20;
  
  LightBase::LightBase(&this->super_LightBase,DeltaPosition,renderFromLight,mediumInterface);
  local_20.bits =
       (I->
       super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
       ).bits;
  DenselySampledSpectrum::DenselySampledSpectrum(&this->I,(SpectrumHandle *)&local_20,alloc);
  this->scale = scale;
  fVar1 = cosf(falloffStart * 0.017453292);
  this->cosFalloffStart = fVar1;
  fVar1 = cosf(totalWidth * 0.017453292);
  this->cosFalloffEnd = fVar1;
  if (falloffStart <= totalWidth) {
    return;
  }
  vb = totalWidth;
  va = falloffStart;
  LogFatal<char_const(&)[13],char_const(&)[11],char_const(&)[13],float&,char_const(&)[11],float&>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/lights.cpp"
             ,0x4b0,"Check failed: %s <= %s with %s = %s, %s = %s",(char (*) [13])"falloffStart",
             (char (*) [11])"totalWidth",(char (*) [13])"falloffStart",&va,
             (char (*) [11])"totalWidth",&vb);
}

Assistant:

SpotLight::SpotLight(const Transform &renderFromLight,
                     const MediumInterface &mediumInterface, SpectrumHandle I,
                     Float scale, Float totalWidth, Float falloffStart, Allocator alloc)
    : LightBase(LightType::DeltaPosition, renderFromLight, mediumInterface),
      I(I, alloc),
      scale(scale),
      cosFalloffEnd(std::cos(Radians(totalWidth))),
      cosFalloffStart(std::cos(Radians(falloffStart))) {
    CHECK_LE(falloffStart, totalWidth);
}